

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcList.c
# Opt level: O0

void Mvc_CoverArray2List(Mvc_Cover_t *pCover)

{
  Mvc_Cube_t *pMVar1;
  int iVar2;
  int local_20;
  int i;
  int nCubes;
  Mvc_Cube_t *pCube;
  Mvc_Cover_t *pCover_local;
  
  if (pCover->pCubes == (Mvc_Cube_t **)0x0) {
    __assert_fail("pCover->pCubes",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/mvc/mvcList.c"
                  ,0x13b,"void Mvc_CoverArray2List(Mvc_Cover_t *)");
  }
  iVar2 = Mvc_CoverReadCubeNum(pCover);
  if (iVar2 != 0) {
    if (iVar2 == 1) {
      pMVar1 = *pCover->pCubes;
      pMVar1->pNext = (Mvc_Cube_t *)0x0;
      (pCover->lCubes).pTail = pMVar1;
      (pCover->lCubes).pHead = pMVar1;
    }
    else {
      (pCover->lCubes).pHead = *pCover->pCubes;
      pMVar1 = pCover->pCubes[iVar2 + -1];
      pMVar1->pNext = (Mvc_Cube_t *)0x0;
      (pCover->lCubes).pTail = pMVar1;
      for (local_20 = 0; local_20 < iVar2 + -1; local_20 = local_20 + 1) {
        pCover->pCubes[local_20]->pNext = pCover->pCubes[local_20 + 1];
      }
    }
  }
  return;
}

Assistant:

void Mvc_CoverArray2List( Mvc_Cover_t * pCover )
{
    Mvc_Cube_t * pCube;
    int nCubes, i;

    assert( pCover->pCubes );

    nCubes = Mvc_CoverReadCubeNum(pCover);
    if ( nCubes == 0 )
        return;
    if ( nCubes == 1 )
    {
        pCube    = pCover->pCubes[0];
        pCube->pNext = NULL;
        pCover->lCubes.pHead = pCover->lCubes.pTail = pCube;
        return;
    }
    // set up the first cube
    pCube = pCover->pCubes[0];
    pCover->lCubes.pHead = pCube;
    // set up the last cube
    pCube = pCover->pCubes[nCubes-1];
    pCube->pNext = NULL;
    pCover->lCubes.pTail = pCube;

    // link all cubes starting from the first one
    for ( i = 0; i < nCubes - 1; i++ )
        pCover->pCubes[i]->pNext = pCover->pCubes[i+1];
}